

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::SetActiveDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,ActiveOperationalDataset *aActiveDataset)

{
  char cVar1;
  ushort uVar2;
  type tVar3;
  int iVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  undefined1 auVar8 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  writer write;
  Error error;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  writer local_1d8;
  undefined1 local_1d0 [8];
  pointer local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  string local_1a8;
  type local_180;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  undefined1 local_148 [24];
  parse_func local_130 [1];
  _Any_data local_120;
  code *local_110;
  _Any_data local_100;
  code *local_f0;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  Message local_b8;
  
  local_180 = 0;
  local_170 = 0;
  local_168[0] = 0;
  local_178 = local_168;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_100,aHandler);
  uVar2 = aActiveDataset->mPresentFlags;
  if ((short)uVar2 < 0) {
    if ((uVar2 >> 0xe & 1) != 0) {
      local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
      pcVar5 = 
      "Channel cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_150._M_p =
           "Channel cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_148._0_8_ = 0x6b;
      local_148._8_8_ = 0;
      local_130[0] = (parse_func)0x0;
      local_1d8.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      local_148._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      do {
        cVar1 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_1d8,pcVar5,"");
            goto LAB_001bb285;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_1d8,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_158);
      } while (pcVar5 != "");
LAB_001bb285:
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1a8,
                 (v10 *)
                 "Channel cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
                 ,(string_view)ZEXT816(0x6b),args_01);
      local_1d0._0_4_ = 2;
      local_1c8 = (pointer)(local_1c0._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      goto LAB_001bb571;
    }
    if ((uVar2 >> 8 & 1) != 0) {
      local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
      pcVar5 = 
      "PAN ID cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_150._M_p =
           "PAN ID cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_148._0_8_ = 0x6a;
      local_148._8_8_ = 0;
      local_130[0] = (parse_func)0x0;
      local_1d8.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      local_148._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      do {
        cVar1 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_1d8,pcVar5,"");
            goto LAB_001bb365;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_1d8,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_158);
      } while (pcVar5 != "");
LAB_001bb365:
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1a8,
                 (v10 *)
                 "PAN ID cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
                 ,(string_view)ZEXT816(0x6a),args_02);
      local_1d0._0_4_ = 2;
      local_1c8 = (pointer)(local_1c0._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      goto LAB_001bb571;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
      pcVar5 = 
      "Mesh-Local Prefix cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_150._M_p =
           "Mesh-Local Prefix cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_148._0_8_ = 0x75;
      local_148._8_8_ = 0;
      local_130[0] = (parse_func)0x0;
      local_1d8.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      local_148._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      do {
        cVar1 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_1d8,pcVar5,"");
            goto LAB_001bb445;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_1d8,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_158);
      } while (pcVar5 != "");
LAB_001bb445:
      args_03.field_1.args_ = in_R9.args_;
      args_03.desc_ = (unsigned_long_long)local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1a8,
                 (v10 *)
                 "Mesh-Local Prefix cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
                 ,(string_view)ZEXT816(0x75),args_03);
      local_1d0._0_4_ = 2;
      local_1c8 = (pointer)(local_1c0._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      goto LAB_001bb571;
    }
    if ((uVar2 >> 10 & 1) != 0) {
      local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
      pcVar5 = 
      "Network Master Key cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_150._M_p =
           "Network Master Key cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
      ;
      local_148._0_8_ = 0x76;
      local_148._8_8_ = 0;
      local_130[0] = (parse_func)0x0;
      local_1d8.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      local_148._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      do {
        cVar1 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_1d8,pcVar5,"");
            goto LAB_001bb525;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_1d8,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_158);
      } while (pcVar5 != "");
LAB_001bb525:
      args_04.field_1.args_ = in_R9.args_;
      args_04.desc_ = (unsigned_long_long)local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_1a8,
                 (v10 *)
                 "Network Master Key cannot be set with Active Operational Dataset, try setting with Pending Operational Dataset instead"
                 ,(string_view)ZEXT816(0x76),args_04);
      local_1d0._0_4_ = 2;
      local_1c8 = (pointer)(local_1c0._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      goto LAB_001bb571;
    }
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
    if ((char)iVar4 == '\0') {
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      args_05.field_1.args_ = in_R9.args_;
      args_05.desc_ = (unsigned_long_long)&local_1a8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_1d0,(v10 *)0x249d58,(string_view)ZEXT816(0x1e),args_05);
      local_158._0_4_ = 0xf;
      local_150._M_p = local_148 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_1d0,local_1c8 + (long)local_1d0);
      local_180 = local_158._0_4_;
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_150);
      if (local_150._M_p != local_148 + 8) {
        operator_delete(local_150._M_p);
      }
      paVar6 = &local_1c0;
      goto LAB_001bb59a;
    }
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"/c/as","");
    coap::Message::SetUriPath((Error *)local_158,&local_b8,(string *)local_1d0);
    local_180 = local_158._0_4_;
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_150);
    tVar3 = local_180;
    if (local_150._M_p != local_148 + 8) {
      operator_delete(local_150._M_p);
    }
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0);
    }
    if (tVar3 != none_type) goto LAB_001bb5a8;
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_1d0,kCommissionerSessionId,(uint16_t)iVar4,kMeshCoP);
    AppendTlv((Error *)local_158,&local_b8,(Tlv *)local_1d0);
    local_180 = local_158._0_4_;
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_150);
    tVar3 = local_180;
    pcVar5 = local_148 + 8;
    if (local_150._M_p != pcVar5) {
      operator_delete(local_150._M_p);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if (tVar3 != none_type) goto LAB_001bb5a8;
    EncodeActiveOperationalDataset((Error *)local_158,&local_b8,aActiveDataset);
    local_180 = local_158._0_4_;
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_150);
    tVar3 = local_180;
    if (local_150._M_p != pcVar5) {
      operator_delete(local_150._M_p);
    }
    if (tVar3 != none_type) goto LAB_001bb5a8;
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar4 != '\0') {
      SignRequest((Error *)local_158,this,&local_b8,kMeshCoP,true);
      local_180 = local_158._0_4_;
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_150);
      tVar3 = local_180;
      if (local_150._M_p != pcVar5) {
        operator_delete(local_150._M_p);
      }
      if (tVar3 != none_type) goto LAB_001bb5a8;
    }
    std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
    function<ot::commissioner::CommissionerImpl::SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)::__4&,void>
              ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
               local_120._M_pod_data,(anon_class_32_1_d0c21527 *)&local_100);
    ProxyClient::SendRequest
              (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_120,0xfc00,0xf0bf);
    if (local_110 != (code *)0x0) {
      (*local_110)(&local_120,&local_120,__destroy_functor);
    }
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"mgmt","");
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_1a8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_1d0,(v10 *)"sent MGMT_ACTIVE_SET.req",(string_view)ZEXT816(0x18),
               args_00);
    Log(kDebug,(string *)local_158,(string *)local_1d0);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0);
    }
    auVar8 = local_158;
    if (local_158 == (undefined1  [8])local_148) goto LAB_001bb5a8;
  }
  else {
    local_158 = (undefined1  [8])((ulong)local_158 & 0xffffffff00000000);
    pcVar5 = "Active Timestamp is mandatory for an Active Operational Dataset";
    local_150._M_p = "Active Timestamp is mandatory for an Active Operational Dataset";
    local_148._0_8_ = 0x3f;
    local_148._8_8_ = 0;
    local_130[0] = (parse_func)0x0;
    local_1d8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    local_148._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    do {
      cVar1 = *pcVar5;
      pcVar7 = pcVar5;
      while (cVar1 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_1d8,pcVar5,"");
          goto LAB_001baebc;
        }
        cVar1 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_1d8,pcVar5,pcVar7);
      pcVar5 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar7,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_158);
    } while (pcVar5 != "");
LAB_001baebc:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_158;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1a8,(v10 *)"Active Timestamp is mandatory for an Active Operational Dataset",
               (string_view)ZEXT816(0x3f),args);
    local_1d0._0_4_ = 2;
    local_1c8 = (pointer)(local_1c0._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
LAB_001bb571:
    local_180 = local_1d0._0_4_;
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_1c8);
    if (local_1c8 != (pointer)(local_1c0._M_local_buf + 8)) {
      operator_delete(local_1c8);
    }
    paVar6 = &local_1a8.field_2;
LAB_001bb59a:
    auVar8 = (undefined1  [8])*(pointer *)(paVar6->_M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(pointer *)(paVar6->_M_local_buf + -0x10) == paVar6) goto LAB_001bb5a8;
  }
  operator_delete((void *)auVar8);
LAB_001bb5a8:
  if (local_180 != none_type) {
    local_e0._0_4_ = local_180;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_178,local_178 + local_170);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_e0);
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  return;
}

Assistant:

void CommissionerImpl::SetActiveDataset(ErrorHandler aHandler, const ActiveOperationalDataset &aActiveDataset)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    VerifyOrExit(aActiveDataset.mPresentFlags & ActiveOperationalDataset::kActiveTimestampBit,
                 error = ERROR_INVALID_ARGS("Active Timestamp is mandatory for an Active Operational Dataset"));

    // TLVs affect connectivity are not allowed.
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kChannelBit) == 0,
                 error = ERROR_INVALID_ARGS("Channel cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit) == 0,
                 error = ERROR_INVALID_ARGS("PAN ID cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit) == 0,
                 error = ERROR_INVALID_ARGS("Mesh-Local Prefix cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit) == 0,
                 error = ERROR_INVALID_ARGS("Network Master Key cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtActiveSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = EncodeActiveOperationalDataset(request, aActiveDataset));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_ACTIVE_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}